

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::are_equal<agge::agge_vector<float>,agge::agge_vector<float>>
               (agge_vector<float> *expected,agge_vector<float> *actual,LocationInfo *location)

{
  FailedAssertion *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  bVar1 = agge::operator==(expected,actual);
  if (bVar1) {
    return;
  }
  this = (FailedAssertion *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"Values are not equal!",&local_39);
  FailedAssertion::FailedAssertion(this,&local_38,location);
  __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(const T1 &expected, const T2 &actual, const LocationInfo &location)
	{
		if (!(expected == actual))
			throw FailedAssertion("Values are not equal!", location);
	}